

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::ConditionalExpression::Condition>::
emplace_back<slang::ast::ConditionalExpression::Condition>
          (SmallVectorBase<slang::ast::ConditionalExpression::Condition> *this,Condition *args)

{
  size_type sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  Pattern *pPVar4;
  pointer pCVar5;
  pointer pCVar6;
  pointer pCVar7;
  pointer pCVar8;
  EVP_PKEY_CTX *pEVar9;
  EVP_PKEY_CTX *ctx;
  long lVar10;
  pointer pCVar11;
  
  pCVar11 = this->data_ + this->len;
  if (this->len != this->cap) {
    pPVar4 = args->pattern;
    (pCVar11->expr).ptr = (args->expr).ptr;
    pCVar11->pattern = pPVar4;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar9 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar9 < ctx) {
    pEVar9 = ctx;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    pEVar9 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar10 = (long)pCVar11 - (long)this->data_;
  pCVar5 = (pointer)operator_new((long)pEVar9 << 4);
  pPVar4 = args->pattern;
  *(undefined8 *)((long)pCVar5 + lVar10) = (args->expr).ptr;
  ((undefined8 *)((long)pCVar5 + lVar10))[1] = pPVar4;
  pCVar8 = this->data_;
  pCVar6 = pCVar8 + this->len;
  pCVar7 = pCVar5;
  if (pCVar6 == pCVar11) {
    for (; pCVar8 != pCVar11; pCVar8 = pCVar8 + 1) {
      pPVar4 = pCVar8->pattern;
      (pCVar7->expr).ptr = (pCVar8->expr).ptr;
      pCVar7->pattern = pPVar4;
      pCVar7 = pCVar7 + 1;
    }
  }
  else {
    for (; pCVar8 != pCVar11; pCVar8 = pCVar8 + 1) {
      pPVar4 = pCVar8->pattern;
      (pCVar7->expr).ptr = (pCVar8->expr).ptr;
      pCVar7->pattern = pPVar4;
      pCVar7 = pCVar7 + 1;
    }
    puVar3 = (undefined8 *)(lVar10 + (long)pCVar5);
    for (; pCVar11 != pCVar6; pCVar11 = pCVar11 + 1) {
      pPVar4 = pCVar11->pattern;
      puVar3[2] = (pCVar11->expr).ptr;
      puVar3[3] = pPVar4;
      puVar3 = puVar3 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar9;
  this->data_ = pCVar5;
  return (reference)((long)pCVar5 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }